

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::deleteRows(Highs *this,HighsInt from_row,HighsInt to_row)

{
  HighsInt HVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  undefined4 in_stack_ffffffffffffff60;
  HighsStatus in_stack_ffffffffffffff64;
  HighsIndexCollection *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  HighsStatus in_stack_ffffffffffffffac;
  Highs *in_stack_ffffffffffffffb0;
  HighsStatus local_4;
  
  clearDerivedModelProperties
            ((Highs *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  HVar1 = create((HighsIndexCollection *)&stack0xffffffffffffff98,in_ESI,in_EDX,
                 *(HighsInt *)(in_RDI + 0x13c));
  if (HVar1 == 0) {
    deleteRowsInterface((Highs *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff64 = returnFromHighs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
    local_4 = in_stack_ffffffffffffff64;
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Interval [%d, %d] supplied to Highs::deleteRows is out of range [0, %d)\n",
                 (ulong)in_ESI,(ulong)in_EDX,(ulong)*(uint *)(in_RDI + 0x13c));
    local_4 = kError;
  }
  HighsIndexCollection::~HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return local_4;
}

Assistant:

HighsStatus Highs::deleteRows(const HighsInt from_row, const HighsInt to_row) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_row, to_row, model_.lp_.num_row_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::deleteRows is out of "
                 "range [0, %d)\n",
                 int(from_row), int(to_row), int(model_.lp_.num_row_));
    return HighsStatus::kError;
  }
  deleteRowsInterface(index_collection);
  return returnFromHighs(HighsStatus::kOk);
}